

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O3

void testToLinear(void)

{
  int i;
  long lVar1;
  float __x;
  float __y;
  
  lVar1 = 1;
  do {
    if ((~(uint)lVar1 & 0x7c00) != 0) {
      __x = ABS(*(float *)(_imath_half_to_float_table + lVar1 * 4));
      if (__x <= 1.0) {
        __y = 2.2;
      }
      else {
        __y = __x + -1.0;
        __x = 9.025013;
      }
      powf(__x,__y);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10000);
  puts("test dwaCompressorToLinear[]");
  return;
}

Assistant:

void
testToLinear ()
{
    unsigned short toLinear[65536];

    toLinear[0] = 0;

    for (int i = 1; i < 65536; ++i)
    {
        half  h;
        float sign    = 1;
        float logBase = pow (2.7182818, 2.2);

        // map  NaN and inf to 0
        if ((i & 0x7c00) == 0x7c00)
        {
            toLinear[i] = 0;
            continue;
        }

        //
        // _toLinear - assume i is NATIVE, but our output needs
        //             to get flipped to XDR
        //
        h.setBits (i);
        sign = 1;
        if ((float) h < 0) { sign = -1; }

        if (fabs ((float) h) <= 1.0)
        {
            h = (half) (sign * pow ((float) fabs ((float) h), 2.2f));
        }
        else
        {
            h = (half) (sign * pow (logBase, (float) (fabs ((float) h) - 1.0)));
        }

        {
            char* tmp = (char*) (&toLinear[i]);

            Xdr::write<CharPtrIO> (tmp, h.bits ());
        }
    }

    printf ("test dwaCompressorToLinear[]\n");
    for (int i = 0; i < 65536; ++i)
        assert (
            toLinear[i] ==
            OPENEXR_IMF_INTERNAL_NAMESPACE::dwaCompressorToLinear[i]);
}